

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CollapseButton(ImGuiID id,ImVec2 *pos)

{
  ImDrawList *draw_list;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImVec2 pos_00;
  ImGuiCol local_8c;
  ImVec2 local_6c;
  ImVec2 center;
  ImU32 text_col;
  ImU32 bg_col;
  bool pressed;
  bool held;
  bool hovered;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  undefined1 local_38 [8];
  ImRect bb;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *pos_local;
  ImGuiID id_local;
  
  pIVar1 = GImGui;
  bb.Max = (ImVec2)GImGui->CurrentWindow;
  ImVec2::ImVec2(&local_50,GImGui->FontSize,GImGui->FontSize);
  local_48 = operator+(pos,&local_50);
  _bg_col = operator*(&(pIVar1->Style).FramePadding,2.0);
  local_40 = operator+(&local_48,(ImVec2 *)&bg_col);
  ImRect::ImRect((ImRect *)local_38,pos,&local_40);
  ItemAdd((ImRect *)local_38,id,(ImRect *)0x0);
  text_col._1_1_ =
       ButtonBehavior((ImRect *)local_38,id,(bool *)((long)&text_col + 3),
                      (bool *)((long)&text_col + 2),0);
  if (((text_col._2_1_ & 1) == 0) || ((text_col._3_1_ & 1) == 0)) {
    local_8c = 0x15;
    if ((text_col._3_1_ & 1) != 0) {
      local_8c = 0x16;
    }
  }
  else {
    local_8c = 0x17;
  }
  center.y = (float)GetColorU32(local_8c,1.0);
  center.x = (float)GetColorU32(0,1.0);
  local_6c = ImRect::GetCenter((ImRect *)local_38);
  if (((text_col._3_1_ & 1) != 0) || ((text_col._2_1_ & 1) != 0)) {
    ImDrawList::AddCircleFilled
              (*(ImDrawList **)((long)bb.Max + 0x2b8),&local_6c,pIVar1->FontSize * 0.5 + 1.0,
               (ImU32)center.y,0xc);
  }
  draw_list = *(ImDrawList **)((long)bb.Max + 0x2b8);
  pos_00 = operator+((ImVec2 *)local_38,&(pIVar1->Style).FramePadding);
  RenderArrow(draw_list,pos_00,(ImU32)center.x,((byte)~*(byte *)((long)bb.Max + 0x91) & 1) * 2 + 1,
              1.0);
  bVar2 = IsItemActive();
  if ((bVar2) && (bVar2 = IsMouseDragging(0,-1.0), bVar2)) {
    StartMouseMovingWindow((ImGuiWindow *)bb.Max);
  }
  return (bool)(text_col._1_1_ & 1);
}

Assistant:

bool ImGui::CollapseButton(ImGuiID id, const ImVec2& pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    ItemAdd(bb, id);
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_None);

    // Render
    ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    ImU32 text_col = GetColorU32(ImGuiCol_Text);
    ImVec2 center = bb.GetCenter();
    if (hovered || held)
        window->DrawList->AddCircleFilled(center/*+ ImVec2(0.0f, -0.5f)*/, g.FontSize * 0.5f + 1.0f, bg_col, 12);
    RenderArrow(window->DrawList, bb.Min + g.Style.FramePadding, text_col, window->Collapsed ? ImGuiDir_Right : ImGuiDir_Down, 1.0f);

    // Switch to moving the window after mouse is moved beyond the initial drag threshold
    if (IsItemActive() && IsMouseDragging(0))
        StartMouseMovingWindow(window);

    return pressed;
}